

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

double trng::math::detail::inv_Phi_approx<double>(double x)

{
  int *piVar1;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double q_2;
  double r;
  double q_1;
  double q;
  undefined8 local_8;
  
  if ((in_XMM0_Qa < 0.0) || (1.0 < in_XMM0_Qa)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_8 = std::numeric_limits<double>::quiet_NaN();
  }
  else if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    if ((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) {
      if (0.02425 <= in_XMM0_Qa) {
        if (0.97575 <= in_XMM0_Qa) {
          dVar2 = ln1p(1.67941262730854e-317);
          dVar2 = sqrt(dVar2 * -2.0);
          local_8 = -(((((dVar2 * -0.007784894002430293 + -0.3223964580411365) * dVar2 +
                        -2.400758277161838) * dVar2 + -2.549732539343734) * dVar2 +
                      4.374664141464968) * dVar2 + 2.938163982698783) /
                    ((((dVar2 * 0.007784695709041462 + 0.3224671290700398) * dVar2 +
                      2.445134137142996) * dVar2 + 3.754408661907416) * dVar2 + 1.0);
        }
        else {
          dVar2 = in_XMM0_Qa - 0.5;
          dVar3 = dVar2 * dVar2;
          local_8 = ((((((dVar3 * -39.69683028665376 + 220.9460984245205) * dVar3 +
                        -275.9285104469687) * dVar3 + 138.357751867269) * dVar3 + -30.66479806614716
                      ) * dVar3 + 2.506628277459239) * dVar2) /
                    (((((dVar3 * -54.47609879822406 + 161.5858368580409) * dVar3 +
                       -155.6989798598866) * dVar3 + 66.80131188771972) * dVar3 + -13.28068155288572
                     ) * dVar3 + 1.0);
        }
      }
      else {
        dVar2 = ln(1.67911223539587e-317);
        dVar2 = sqrt(dVar2 * -2.0);
        local_8 = (((((dVar2 * -0.007784894002430293 + -0.3223964580411365) * dVar2 +
                     -2.400758277161838) * dVar2 + -2.549732539343734) * dVar2 + 4.374664141464968)
                   * dVar2 + 2.938163982698783) /
                  ((((dVar2 * 0.007784695709041462 + 0.3224671290700398) * dVar2 + 2.445134137142996
                    ) * dVar2 + 3.754408661907416) * dVar2 + 1.0);
      }
    }
    else {
      local_8 = std::numeric_limits<double>::infinity();
    }
  }
  else {
    local_8 = std::numeric_limits<double>::infinity();
    local_8 = -local_8;
  }
  return local_8;
}

Assistant:

TRNG_CUDA_ENABLE T inv_Phi_approx(T x) {
        using traits = inv_Phi_traits<T>;
        if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::quiet_NaN();
        }
        if (x == 0)
          return -numeric_limits<T>::infinity();
        if (x == 1)
          return numeric_limits<T>::infinity();
        if (x < traits::x_low) {
          // rational approximation for lower region
          const T q{sqrt(-2 * ln(x))};
          return (((((traits::c[0] * q + traits::c[1]) * q + traits::c[2]) * q + traits::c[3]) *
                       q +
                   traits::c[4]) *
                      q +
                  traits::c[5]) /
                 ((((traits::d[0] * q + traits::d[1]) * q + traits::d[2]) * q + traits::d[3]) *
                      q +
                  1);
        } else if (x < traits::x_high) {
          // rational approximation for central region
          const T q{x - traits::one_half};
          const T r{q * q};
          return (((((traits::a[0] * r + traits::a[1]) * r + traits::a[2]) * r + traits::a[3]) *
                       r +
                   traits::a[4]) *
                      r +
                  traits::a[5]) *
                 q /
                 (((((traits::b[0] * r + traits::b[1]) * r + traits::b[2]) * r + traits::b[3]) *
                       r +
                   traits::b[4]) *
                      r +
                  1);
        } else {
          // rational approximation for upper region
          const T q{sqrt(-2 * ln1p(-x))};
          return -(((((traits::c[0] * q + traits::c[1]) * q + traits::c[2]) * q +
                     traits::c[3]) *
                        q +
                    traits::c[4]) *
                       q +
                   traits::c[5]) /
                 ((((traits::d[0] * q + traits::d[1]) * q + traits::d[2]) * q + traits::d[3]) *
                      q +
                  1);
        }
      }